

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_swap.cpp
# Opt level: O0

bool Omega_h::swap_edges(Mesh *mesh,AdaptOpts *opts)

{
  Int IVar1;
  char *file;
  bool local_b9;
  __cxx11 local_b8 [7];
  bool ret;
  allocator local_81;
  string local_80 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40 [39];
  ScopedTimer local_19;
  AdaptOpts *pAStack_18;
  ScopedTimer omega_h_scoped_function_timer;
  AdaptOpts *opts_local;
  Mesh *mesh_local;
  
  pAStack_18 = opts;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_80,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_swap.cpp"
             ,&local_81);
  std::operator+(local_60,(char *)local_80);
  std::__cxx11::to_string(local_b8,0x2e);
  std::operator+(local_40,local_60);
  file = (char *)std::__cxx11::string::c_str();
  ScopedTimer::ScopedTimer(&local_19,"swap_edges",file);
  std::__cxx11::string::~string((string *)local_40);
  std::__cxx11::string::~string((string *)local_b8);
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  local_b9 = false;
  IVar1 = Mesh::dim(mesh);
  if (IVar1 == 3) {
    local_b9 = swap_edges_3d(mesh,pAStack_18);
  }
  else {
    IVar1 = Mesh::dim(mesh);
    if (IVar1 == 2) {
      local_b9 = swap_edges_2d(mesh,pAStack_18);
    }
  }
  ScopedTimer::~ScopedTimer(&local_19);
  return local_b9;
}

Assistant:

bool swap_edges(Mesh* mesh, AdaptOpts const& opts) {
  OMEGA_H_TIME_FUNCTION;
  bool ret = false;
  if (mesh->dim() == 3)
    ret = swap_edges_3d(mesh, opts);
  else if (mesh->dim() == 2)
    ret = swap_edges_2d(mesh, opts);
  return ret;
}